

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_fmr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 dst;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = rB(ctx->opcode);
    get_fpr(tcg_ctx_00,dst,uVar1);
    uVar1 = rD(ctx->opcode);
    set_fpr(tcg_ctx_00,uVar1,dst);
    uVar1 = Rc(ctx->opcode);
    if (uVar1 != 0) {
      gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx_00,dst);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_fmr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i64 t0;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t0, rB(ctx->opcode));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    if (unlikely(Rc(ctx->opcode))) {
        gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
}